

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int CollectionSetHeader(unqlite_kv_engine *pEngine,unqlite_col *pCol,jx9_int64 iRec,jx9_int64 iTotal
                       ,jx9_value *pSchema)

{
  SyBlob *pBlob;
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  sxi32 sVar4;
  sxi32 unaff_EBP;
  unqlite_vfs *pVfs;
  sxu32 iDos;
  undefined8 local_48;
  unqlite_kv_engine *local_40;
  unqlite_kv_methods *local_38;
  
  if (pEngine == (unqlite_kv_engine *)0x0) {
    pEngine = ((pCol->pVm->pDb->sDB).pPager)->pEngine;
  }
  pBlob = &pCol->sHeader;
  local_38 = pEngine->pIo->pMethods;
  if ((pCol->sHeader).nByte == 0) {
    local_48 = CONCAT62(local_48._2_6_,0x1e61);
    unaff_EBP = SyBlobAppend(pBlob,&local_48,2);
    if (unaff_EBP == 0) {
      local_48 = 0;
      unaff_EBP = SyBlobAppend(pBlob,&local_48,8);
      if (unaff_EBP == 0) {
        local_48 = 0;
        pVfs = (unqlite_vfs *)pBlob;
        unaff_EBP = SyBlobAppend(pBlob,&local_48,8);
        if (unaff_EBP == 0) {
          unixCurrentTime(pVfs,&pCol->sCreation);
          SyTimeFormatToDos(&pCol->sCreation,(sxu32 *)&local_48);
          unaff_EBP = SyBlobAppendBig32(pBlob,(sxu32)local_48);
          if (unaff_EBP == 0) {
            pCol->nSchemaOfft = (pCol->sHeader).nByte;
            bVar2 = true;
            bVar3 = true;
            unaff_EBP = (sxi32)&local_48;
            goto joined_r0x00119d35;
          }
        }
      }
    }
    bVar3 = false;
    bVar2 = false;
  }
  else {
    pvVar1 = (pCol->sHeader).pBlob;
    if (-1 < iRec) {
      *(ulong *)((long)pvVar1 + 2) =
           (ulong)iRec >> 0x38 | (iRec & 0xff000000000000U) >> 0x28 |
           (iRec & 0xff0000000000U) >> 0x18 | (iRec & 0xff00000000U) >> 8 |
           (iRec & 0xff000000U) << 8 | (iRec & 0xff0000U) << 0x18 | (iRec & 0xff00U) << 0x28 |
           iRec << 0x38;
    }
    if (-1 < iTotal) {
      *(ulong *)((long)pvVar1 + 10) =
           (ulong)iTotal >> 0x38 | (iTotal & 0xff000000000000U) >> 0x28 |
           (iTotal & 0xff0000000000U) >> 0x18 | (iTotal & 0xff00000000U) >> 8 |
           (iTotal & 0xff000000U) << 8 | (iTotal & 0xff0000U) << 0x18 | (iTotal & 0xff00U) << 0x28 |
           iTotal << 0x38;
    }
    bVar3 = -1 < iTotal || -1 < iRec;
    bVar2 = true;
    local_40 = pEngine;
    if (pSchema != (jx9_value *)0x0) {
      if (pCol->nSchemaOfft < (pCol->sHeader).nByte) {
        (pCol->sHeader).nByte = pCol->nSchemaOfft;
      }
      sVar4 = FastJsonEncode(pSchema,pBlob,0);
      if (sVar4 == 0) {
        jx9MemObjStore(pSchema,&pCol->sSchema);
        bVar3 = true;
        pEngine = local_40;
      }
      else {
        bVar2 = false;
        pEngine = local_40;
        unaff_EBP = sVar4;
      }
    }
  }
joined_r0x00119d35:
  if (bVar2) {
    if ((bVar3) &&
       (unaff_EBP = (*local_38->xReplace)
                              (pEngine,(pCol->sName).zString,(pCol->sName).nByte,
                               (pCol->sHeader).pBlob,(unqlite_int64)(pCol->sHeader).nByte),
       unaff_EBP != 0)) {
      unqliteGenErrorFormat
                (pCol->pVm->pDb,
                 "Cannot save collection \'%z\' header in the underlying storage engine",
                 &pCol->sName);
    }
    else {
      unaff_EBP = 0;
    }
  }
  return unaff_EBP;
}

Assistant:

static int CollectionSetHeader(
	unqlite_kv_engine *pEngine, /* Underlying KV storage engine */
	unqlite_col *pCol,          /* Target collection */
	jx9_int64 iRec,             /* Last record ID */
	jx9_int64 iTotal,           /* Total number of records in this collection */
	jx9_value *pSchema          /* Collection schema */
	)
{
	SyBlob *pHeader = &pCol->sHeader;
	unqlite_kv_methods *pMethods;
	int iWrite = 0;
	int rc;
	if( pEngine == 0 ){
		/* Default storage engine */
		pEngine = unqlitePagerGetKvEngine(pCol->pVm->pDb);
	}
	pMethods = pEngine->pIo->pMethods;
	if( SyBlobLength(pHeader) < 1 ){
		Sytm *pCreate = &pCol->sCreation; /* Creation time */
		unqlite_vfs *pVfs;
		sxu32 iDos;
		/* Magic number */
		rc = SyBlobAppendBig16(pHeader,UNQLITE_COLLECTION_MAGIC);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Initial record ID */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Total records in the collection */
		rc = SyBlobAppendBig64(pHeader,0);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		pVfs = (unqlite_vfs *)unqliteExportBuiltinVfs();
		/* Creation time of the collection */
		if( pVfs->xCurrentTime ){
			/* Get the creation time */
			pVfs->xCurrentTime(pVfs,pCreate);
		}else{
			/* Zero the structure */
			SyZero(pCreate,sizeof(Sytm));
		}
		/* Convert to DOS time */
		SyTimeFormatToDos(pCreate,&iDos);
		rc = SyBlobAppendBig32(pHeader,iDos);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Offset to start writing collection schema */
		pCol->nSchemaOfft = SyBlobLength(pHeader);
		iWrite = 1;
	}else{
		unsigned char *zBinary = (unsigned char *)SyBlobData(pHeader);
		/* Header update */
		if( iRec >= 0 ){
			/* Update record ID */
			SyBigEndianPack64(&zBinary[2/* Magic number*/],(sxu64)iRec);
			iWrite = 1;
		}
		if( iTotal >= 0 ){
			/* Total records */
			SyBigEndianPack64(&zBinary[2/* Magic number*/+8/* Record ID*/],(sxu64)iTotal);
			iWrite = 1;
		}
		if( pSchema ){
			/* Collection Schema */
			SyBlobTruncate(pHeader,pCol->nSchemaOfft);
			/* Encode the schema to FastJson */
			rc = FastJsonEncode(pSchema,pHeader,0);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			/* Copy the collection schema */
			jx9MemObjStore(pSchema,&pCol->sSchema);
			iWrite = 1;
		}
	}
	if( iWrite ){
		SyString *pId = &pCol->sName;
		/* Reflect the disk and/or in-memory image */
		rc = pMethods->xReplace(pEngine,
			(const void *)pId->zString,pId->nByte,
			SyBlobData(pHeader),SyBlobLength(pHeader)
			);
		if( rc != UNQLITE_OK ){
			unqliteGenErrorFormat(pCol->pVm->pDb,
				"Cannot save collection '%z' header in the underlying storage engine",
				pId
				);
			return rc;
		}
	}
	return UNQLITE_OK;
}